

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O3

int asn1_string_set_uint64(ASN1_STRING *out,uint64_t v,int type)

{
  int iVar1;
  long lVar2;
  uint8_t buf [8];
  ulong local_18;
  
  local_18 = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
             (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
             (v & 0xff00) << 0x28 | v << 0x38;
  lVar2 = 0;
  do {
    if (*(char *)((long)&local_18 + lVar2) != '\0') goto LAB_00202b8a;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  lVar2 = 8;
LAB_00202b8a:
  iVar1 = ASN1_STRING_set((ASN1_STRING *)out,(void *)((long)&local_18 + lVar2),8 - (int)lVar2);
  if (iVar1 != 0) {
    out->type = type;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int asn1_string_set_uint64(ASN1_STRING *out, uint64_t v, int type) {
  uint8_t buf[sizeof(uint64_t)];
  CRYPTO_store_u64_be(buf, v);
  size_t leading_zeros;
  for (leading_zeros = 0; leading_zeros < sizeof(buf); leading_zeros++) {
    if (buf[leading_zeros] != 0) {
      break;
    }
  }

  if (!ASN1_STRING_set(out, buf + leading_zeros, sizeof(buf) - leading_zeros)) {
    return 0;
  }
  out->type = type;
  return 1;
}